

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeWebAssemblyTableConstructor
               (DynamicObject *constructor,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  Var value;
  DynamicObject **ppDVar1;
  JavascriptString *value_00;
  JavascriptLibrary *library;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *constructor_local;
  
  DeferredTypeHandlerBase::Convert(typeHandler,constructor,mode,3,0);
  this = RecyclableObject::GetLibrary(&constructor->super_RecyclableObject);
  value = TaggedInt::ToVarUnchecked(1);
  AddMember(this,constructor,0xd1,value,'\x02');
  ppDVar1 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                      ((WriteBarrierPtr *)&this->webAssemblyTablePrototype);
  AddMember(this,constructor,0x124,*ppDVar1,'\0');
  value_00 = CreateStringFromCppLiteral<6ul>(this,(char16 (*) [6])0x1893802);
  AddMember(this,constructor,0x106,value_00,'\x02');
  DynamicObject::SetHasNoEnumerableProperties(constructor,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeWebAssemblyTableConstructor(DynamicObject* constructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(constructor, mode, 3);
        JavascriptLibrary* library = constructor->GetLibrary();

        library->AddMember(constructor, PropertyIds::length, TaggedInt::ToVarUnchecked(1), PropertyConfigurable);
        library->AddMember(constructor, PropertyIds::prototype, library->webAssemblyTablePrototype, PropertyNone);
        library->AddMember(constructor, PropertyIds::name, library->CreateStringFromCppLiteral(_u("Table")), PropertyConfigurable);

        constructor->SetHasNoEnumerableProperties(true);

        return true;
    }